

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlSetAttrItem::RhsPrettyPrint
          (GdlSetAttrItem *this,GrcManager *pcman,GdlRule *prule,int irit,ostream *strmOut,bool fXml
          )

{
  string local_50;
  
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(&local_50,(this->super_GdlRuleItem).m_psymInput);
  std::operator<<(strmOut,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (*(this->super_GdlRuleItem)._vptr_GdlRuleItem[0x27])
            (this,pcman,prule,(ulong)(uint)irit,strmOut,(ulong)fXml);
  std::operator<<(strmOut,"  ");
  return;
}

Assistant:

void GdlSetAttrItem::RhsPrettyPrint(GrcManager * pcman, GdlRule * prule, int irit,
	std::ostream & strmOut, bool fXml)
{
	strmOut << m_psymInput->FullAbbrev();
	AttrSetterPrettyPrint(pcman, prule, irit, strmOut, fXml);
	strmOut << "  ";
}